

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

ssize_t __thiscall
libtorrent::aux::udp_socket::read(udp_socket *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  index_type iVar2;
  type data;
  size_t sVar3;
  pointer this_00;
  pointer p_00;
  element_type *this_01;
  packet *this_02;
  undefined4 in_register_00000034;
  byte local_171;
  bool local_139;
  undefined1 local_12c [7];
  bool proxy_only;
  span<char> local_110;
  span<char> local_100;
  error_code local_f0;
  error_code local_e0;
  error_code local_d0;
  error_code local_c0;
  error_code local_b0;
  mutable_buffer local_a0;
  int local_8c;
  undefined1 auStack_88 [4];
  int len;
  packet p;
  int ret;
  int num;
  error_code *ec_local;
  udp_socket *this_local;
  span<libtorrent::aux::udp_socket::packet> pkts_local;
  
  this_local = (udp_socket *)CONCAT44(in_register_00000034,__fd);
  pkts_local.m_ptr = (packet *)__buf;
  iVar2 = span<libtorrent::aux::udp_socket::packet>::size
                    ((span<libtorrent::aux::udp_socket::packet> *)&this_local);
  p.error.cat_._4_4_ = (int)iVar2;
  p.error.cat_._0_4_ = 0;
  packet::packet((packet *)auStack_88);
  do {
    while( true ) {
      do {
        if (p.error.cat_._4_4_ <= (int)(uint)p.error.cat_) goto LAB_00764195;
        data = ::std::
               unique_ptr<std::array<char,_1500UL>,_std::default_delete<std::array<char,_1500UL>_>_>
               ::operator*(&this->m_buf);
        local_a0 = boost::asio::buffer<char,1500ul>(data);
        sVar3 = boost::asio::
                basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                ::receive_from<boost::asio::mutable_buffer>
                          ((basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)this,&local_a0,(endpoint_type *)&p.data.m_len,0,(error_code *)__nbytes
                          );
        local_8c = (int)sVar3;
        boost::system::error_code::error_code<boost::asio::error::basic_errors>
                  (&local_b0,try_again,(type *)0x0);
        bVar1 = boost::system::operator==((error_code *)__nbytes,&local_b0);
        local_139 = true;
        if (!bVar1) {
          boost::system::error_code::error_code<boost::asio::error::basic_errors>
                    (&local_c0,try_again,(type *)0x0);
          bVar1 = boost::system::operator==((error_code *)__nbytes,&local_c0);
          local_139 = true;
          if (!bVar1) {
            boost::system::error_code::error_code<boost::asio::error::basic_errors>
                      (&local_d0,operation_aborted,(type *)0x0);
            bVar1 = boost::system::operator==((error_code *)__nbytes,&local_d0);
            local_139 = true;
            if (!bVar1) {
              boost::system::error_code::error_code<boost::asio::error::basic_errors>
                        (&local_e0,bad_descriptor,(type *)0x0);
              local_139 = boost::system::operator==((error_code *)__nbytes,&local_e0);
            }
          }
        }
        if (local_139 != false) {
          pkts_local.m_len._4_4_ = (uint)p.error.cat_;
          goto LAB_0076419b;
        }
        boost::system::error_code::error_code<boost::asio::error::basic_errors>
                  (&local_f0,interrupted,(type *)0x0);
        bVar1 = boost::system::operator==((error_code *)__nbytes,&local_f0);
      } while (bVar1);
      bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)__nbytes);
      if (bVar1) break;
      this_00 = ::std::
                unique_ptr<std::array<char,_1500UL>,_std::default_delete<std::array<char,_1500UL>_>_>
                ::operator->(&this->m_buf);
      p_00 = ::std::array<char,_1500UL>::data(this_00);
      span<char>::span(&local_110,p_00,(long)local_8c);
      _auStack_88 = local_110.m_ptr;
      p.data.m_ptr = (char *)local_110.m_len;
      bVar1 = active_socks5(this);
      if (bVar1) {
        this_01 = ::std::
                  __shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->m_socks5_connection);
        socks5::target((endpoint *)local_12c,this_01);
        bVar1 = boost::asio::ip::operator!=
                          ((basic_endpoint<boost::asio::ip::udp> *)&p.data.m_len,
                           (basic_endpoint<boost::asio::ip::udp> *)local_12c);
        if ((!bVar1) && (bVar1 = unwrap(this,(packet *)auStack_88), bVar1)) goto LAB_00764173;
      }
      else {
        local_171 = 0;
        if (((this->m_proxy_settings).proxy_peer_connections & 1U) != 0) {
          local_171 = (this->m_proxy_settings).proxy_tracker_connections;
        }
        if (((this->m_proxy_settings).type == none) || ((local_171 & 1) == 0)) goto LAB_00764173;
      }
    }
  } while ((this->m_proxy_settings).type != none);
  p.hostname._M_str = *(char **)__nbytes;
  p.error._0_8_ = *(undefined8 *)(__nbytes + 8);
  span<char>::span(&local_100);
  _auStack_88 = local_100.m_ptr;
  p.data.m_ptr = (char *)local_100.m_len;
LAB_00764173:
  this_02 = span<libtorrent::aux::udp_socket::packet>::operator[]
                      ((span<libtorrent::aux::udp_socket::packet> *)&this_local,
                       (long)(int)(uint)p.error.cat_);
  packet::operator=(this_02,(packet *)auStack_88);
  p.error.cat_._0_4_ = (uint)p.error.cat_ + 1;
LAB_00764195:
  pkts_local.m_len._4_4_ = (uint)p.error.cat_;
LAB_0076419b:
  return (ulong)pkts_local.m_len._4_4_;
}

Assistant:

int udp_socket::read(span<packet> pkts, error_code& ec)
{
	auto const num = int(pkts.size());
	int ret = 0;
	packet p;

	while (ret < num)
	{
		int const len = int(m_socket.receive_from(boost::asio::buffer(*m_buf)
			, p.from, 0, ec));

		if (ec == error::would_block
			|| ec == error::try_again
			|| ec == error::operation_aborted
			|| ec == error::bad_descriptor)
		{
			return ret;
		}

		if (ec == error::interrupted)
		{
			continue;
		}

		if (ec)
		{
			// SOCKS5 cannot wrap ICMP errors. And even if it could, they certainly
			// would not arrive as unwrapped (regular) ICMP errors. If we're using
			// a proxy we must ignore these
			if (m_proxy_settings.type != settings_pack::none) continue;

			p.error = ec;
			p.data = span<char>();
		}
		else
		{
			p.data = {m_buf->data(), len};

			// support packets coming from the SOCKS5 proxy
			if (active_socks5())
			{
				// if the source IP doesn't match the proxy's, ignore the packet
				if (p.from != m_socks5_connection->target()) continue;
				// if we failed to unwrap, silently ignore the packet
				if (!unwrap(p)) continue;
			}
			else
			{
				// if we don't proxy trackers or peers, we may be receiving unwrapped
				// packets and we must let them through.
				bool const proxy_only
					= m_proxy_settings.proxy_peer_connections
					&& m_proxy_settings.proxy_tracker_connections
					;

				// if we proxy everything, block all packets that aren't coming from
				// the proxy
				if (m_proxy_settings.type != settings_pack::none && proxy_only) continue;
			}
		}

		pkts[ret] = p;
		++ret;

		// we only have a single buffer for now, so we can only return a
		// single packet. In the future though, we could attempt to drain
		// the socket here, or maybe even use recvmmsg()
		break;
	}

	return ret;
}